

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O1

void __thiscall
FastPForLib::SimplePFor<FastPForLib::Simple8b<true>_>::encodeArray
          (SimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t *in,size_t length,uint32_t *out,
          size_t *nvalue)

{
  uint32_t *puVar1;
  ulong uVar2;
  size_t length_00;
  uint32_t *out_00;
  size_t thisnvalue;
  size_t local_48;
  uint32_t *local_40;
  SimplePFor<FastPForLib::Simple8b<true>_> *local_38;
  
  checkifdivisibleby(length,0x80);
  *out = (uint32_t)length;
  uVar2 = *nvalue;
  *nvalue = 1;
  if (length != 0) {
    puVar1 = in + length;
    out_00 = out + 1;
    local_40 = puVar1;
    local_38 = this;
    do {
      length_00 = (long)puVar1 - (long)in >> 2;
      if (in + local_38->PageSize < puVar1) {
        length_00 = (ulong)local_38->PageSize;
      }
      local_48 = uVar2 - ((long)out_00 - (long)out >> 2);
      __encodeArray(local_38,in,length_00,out_00,&local_48);
      *nvalue = *nvalue + local_48;
      out_00 = out_00 + local_48;
      in = in + length_00;
    } while (in != puVar1);
  }
  if (uVar2 < *nvalue) {
    fprintf(_stderr,
            "It is possible we have a buffer overrun. You reported having allocated %zu bytes for the compressed data but we needed %zu bytes. Please increase the available memory for compressed data or check the value of the last parameter provided to the encodeArray method.\n"
            ,uVar2 << 2,*nvalue << 2);
  }
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) override {
    checkifdivisibleby(length, BlockSize);
    const uint32_t *const initout(out);
    const uint32_t *const finalin(in + length);

    *out++ = static_cast<uint32_t>(length);
    const size_t oldnvalue = nvalue;
    nvalue = 1;
    while (in != finalin) {
      size_t thissize = static_cast<size_t>(
          finalin > PageSize + in ? PageSize : (finalin - in));
      size_t thisnvalue = oldnvalue - (out - initout);
      __encodeArray(in, thissize, out, thisnvalue);
      nvalue += thisnvalue;
      out += thisnvalue;
      in += thissize;
    }
    assert(out == nvalue + initout);
    if (oldnvalue < nvalue)
      fprintf(stderr,
          "It is possible we have a buffer overrun. You reported having allocated "
          "%zu bytes for the compressed data but we needed "
          "%zu bytes. Please increase the available memory "
          "for compressed data or check the value of the last parameter provided "
          "to the encodeArray method.\n",
          oldnvalue * sizeof(uint32_t), nvalue * sizeof(uint32_t));
  }